

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void * columnName(sqlite3_stmt *pStmt,int N,int useUtf16,int useType)

{
  int *piVar1;
  ushort uVar2;
  long lVar3;
  undefined2 uVar4;
  void *pvVar5;
  
  uVar2 = *(ushort *)(pStmt + 0xc0);
  if ((uint)N < (uint)uVar2) {
    lVar3 = *(long *)pStmt;
    if (*(sqlite3_mutex **)(lVar3 + 0x18) != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(lVar3 + 0x18));
    }
    pvVar5 = sqlite3ValueText((sqlite3_value *)
                              ((ulong)((uint)uVar2 * useType + N) * 0x38 + *(long *)(pStmt + 0x98)),
                              '\x02' - (useUtf16 == 0));
    if (*(char *)(lVar3 + 0x67) != '\0') {
      if (*(int *)(lVar3 + 0xdc) == 0) {
        *(undefined1 *)(lVar3 + 0x67) = 0;
        *(undefined4 *)(lVar3 + 400) = 0;
        piVar1 = (int *)(lVar3 + 0x198);
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          uVar4 = *(undefined2 *)(lVar3 + 0x19e);
        }
        else {
          uVar4 = 0;
        }
        *(undefined2 *)(lVar3 + 0x19c) = uVar4;
      }
      pvVar5 = (void *)0x0;
    }
    if (*(sqlite3_mutex **)(lVar3 + 0x18) != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(lVar3 + 0x18));
    }
  }
  else {
    pvVar5 = (void *)0x0;
  }
  return pvVar5;
}

Assistant:

static const void *columnName(
  sqlite3_stmt *pStmt,     /* The statement */
  int N,                   /* Which column to get the name for */
  int useUtf16,            /* True to return the name as UTF16 */
  int useType              /* What type of name */
){
  const void *ret;
  Vdbe *p;
  int n;
  sqlite3 *db;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pStmt==0 ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  ret = 0;
  p = (Vdbe *)pStmt;
  db = p->db;
  assert( db!=0 );
  n = sqlite3_column_count(pStmt);
  if( N<n && N>=0 ){
    N += useType*n;
    sqlite3_mutex_enter(db->mutex);
    assert( db->mallocFailed==0 );
#ifndef SQLITE_OMIT_UTF16
    if( useUtf16 ){
      ret = sqlite3_value_text16((sqlite3_value*)&p->aColName[N]);
    }else
#endif
    {
      ret = sqlite3_value_text((sqlite3_value*)&p->aColName[N]);
    }
    /* A malloc may have failed inside of the _text() call. If this
    ** is the case, clear the mallocFailed flag and return NULL.
    */
    if( db->mallocFailed ){
      sqlite3OomClear(db);
      ret = 0;
    }
    sqlite3_mutex_leave(db->mutex);
  }
  return ret;
}